

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_count.hpp
# Opt level: O2

void __thiscall boost::detail::shared_count::~shared_count(shared_count *this)

{
  if (this->pi_ != (sp_counted_base *)0x0) {
    sp_counted_base::release(this->pi_);
  }
  return;
}

Assistant:

~shared_count() /*BOOST_SP_NOEXCEPT*/
    {
        if( pi_ != 0 ) pi_->release();
#if defined(BOOST_SP_ENABLE_DEBUG_HOOKS)
        id_ = 0;
#endif
    }